

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpecsOf.hpp
# Opt level: O3

string * __thiscall
sciplot::TextSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,TextSpecsOf<sciplot::TicsSpecs> *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(this->m_enhanced)._M_dataplus._M_p,
                      (this->m_enhanced)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," textcolor ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->m_color)._M_dataplus._M_p,(this->m_color)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  FontSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
            (&local_1e8,&this->super_FontSpecsOf<sciplot::TicsSpecs>);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

auto TextSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    std::stringstream ss;
    ss << m_enhanced << " textcolor " << m_color << " ";
    ss << FontSpecsOf<DerivedSpecs>::repr();
    return internal::removeExtraWhitespaces(ss.str());
}